

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O3

void __thiscall
anurbs::PointOnCurveProjection<3L>::PointOnCurveProjection
          (PointOnCurveProjection<3L> *this,Pointer<CurveBaseD>_conflict *curve,double tolerance,
          double tessellation_tolerance)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pMVar3;
  pointer pMVar4;
  _Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false> __ptr_00;
  bool bVar5;
  CurveBaseD *in_RDX;
  CurveTessellation<3L> *this_00;
  pointer *__ptr;
  Unique<PolylineMapper<3L>_> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  local_58;
  
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (CurveTessellation<3L> *)
            (curve->super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  this_02 = (curve->super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = this_02;
  if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this->m_tessellation_tolerance = tessellation_tolerance;
    this->m_tolerance = tolerance;
    (this->mapper)._M_t.
    super___uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_anurbs::PolylineMapper<3L>_*,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
    .super__Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>._M_head_impl =
         (PolylineMapper<3L> *)0x0;
LAB_00192dfc:
    bVar5 = true;
    this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
      this_00 = (CurveTessellation<3L> *)
                (this->m_curve).
                super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_02 = (this->m_curve).
                super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      this->m_tessellation_tolerance = tessellation_tolerance;
      this->m_tolerance = tolerance;
      (this->mapper)._M_t.
      super___uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_anurbs::PolylineMapper<3L>_*,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
      .super__Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>._M_head_impl =
           (PolylineMapper<3L> *)0x0;
      if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00192dfc;
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
      this->m_tessellation_tolerance = tessellation_tolerance;
      this->m_tolerance = tolerance;
      (this->mapper)._M_t.
      super___uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_anurbs::PolylineMapper<3L>_*,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
      .super__Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>._M_head_impl =
           (PolylineMapper<3L> *)0x0;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
      tessellation_tolerance = this->m_tessellation_tolerance;
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
    bVar5 = false;
  }
  this_01 = &this->mapper;
  CurveTessellation<3L>::compute(&local_58,this_00,in_RDX,tessellation_tolerance);
  pdVar1 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
  }
  pMVar3 = (this->m_tessellation).second.
           super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar4 = (this->m_tessellation).second.
           super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.second.
       super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.second.
       super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.second.
       super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pMVar3 != (pointer)0x0) {
    operator_delete(pMVar3,(long)pMVar4 - (long)pMVar3);
    if (local_58.second.
        super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.second.
                      super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.second.
                            super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.second.
                            super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((PolylineMapper<3L> *)
      local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (PolylineMapper<3L> *)0x0) {
    operator_delete(local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (!bVar5) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  new_<anurbs::PolylineMapper<3l>,std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>&>
            ((anurbs *)&local_58,&(this->m_tessellation).second);
  pdVar1 = local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  __ptr_00._M_head_impl =
       (this_01->_M_t).
       super___uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_anurbs::PolylineMapper<3L>_*,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
       .super__Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>._M_head_impl;
  (this_01->_M_t).
  super___uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_anurbs::PolylineMapper<3L>_*,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
  .super__Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>._M_head_impl =
       (PolylineMapper<3L> *)pdVar1;
  if (__ptr_00._M_head_impl != (PolylineMapper<3L> *)0x0) {
    std::default_delete<anurbs::PolylineMapper<3L>_>::operator()
              ((default_delete<anurbs::PolylineMapper<3L>_> *)this_01,__ptr_00._M_head_impl);
    if ((PolylineMapper<3L> *)
        local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (PolylineMapper<3L> *)0x0) {
      std::default_delete<anurbs::PolylineMapper<3L>_>::operator()
                ((default_delete<anurbs::PolylineMapper<3L>_> *)&local_58,
                 (PolylineMapper<3L> *)
                 local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

PointOnCurveProjection(Pointer<CurveBaseD> curve, const double tolerance, const double tessellation_tolerance)
        : m_tessellation()
        , m_curve(curve)
        , m_tessellation_tolerance(tessellation_tolerance)
        , m_tolerance(tolerance)
    {
        // new_ polyline
        m_tessellation = CurveTessellation<TDimension>::compute(*Curve(), m_tessellation_tolerance);
        mapper = new_<PolylineMapper<TDimension>>(m_tessellation.second);
    }